

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader.cpp
# Opt level: O0

void __thiscall
stackjit::Loader::Function::Function
          (Function *this,string *name,string *returnType,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *parameters,bool isExternal)

{
  bool isExternal_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *parameters_local;
  string *returnType_local;
  string *name_local;
  Function *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)name);
  std::__cxx11::string::string((string *)&this->mReturnType,(string *)returnType);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->mParameters,parameters);
  this->mIsMemberFunction = false;
  std::__cxx11::string::string((string *)&this->mClassName);
  std::__cxx11::string::string((string *)&this->mMemberFunctionName);
  this->mIsExternal = isExternal;
  std::vector<stackjit::Loader::Instruction,_std::allocator<stackjit::Loader::Instruction>_>::vector
            (&this->mInstructions);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->mLocalTypes);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::Loader::Attribute,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::Loader::Attribute>_>_>
  ::unordered_map(&this->mAttributes);
  return;
}

Assistant:

Loader::Function::Function(std::string name, std::string returnType, const std::vector<std::string>& parameters, bool isExternal)
			: mName(name),
			  mReturnType(returnType),
			  mParameters(parameters),
			  mIsMemberFunction(false),
			  mIsExternal(isExternal) {

	}